

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::RemoveFile(string *source)

{
  int iVar1;
  char *__name;
  int *piVar2;
  undefined1 local_11;
  string *source_local;
  
  __name = (char *)std::__cxx11::string::c_str();
  iVar1 = unlink(__name);
  local_11 = true;
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    local_11 = *piVar2 == 2;
  }
  return local_11;
}

Assistant:

bool SystemTools::RemoveFile(const kwsys_stl::string& source)
{
#ifdef _WIN32
  kwsys_stl::wstring const& ws =
    SystemTools::ConvertToWindowsExtendedPath(source);
  if (DeleteFileW(ws.c_str()))
    {
    return true;
    }
  DWORD err = GetLastError();
  if (err == ERROR_FILE_NOT_FOUND ||
      err == ERROR_PATH_NOT_FOUND)
    {
    return true;
    }
  if (err != ERROR_ACCESS_DENIED)
    {
    return false;
    }
  /* The file may be read-only.  Try adding write permission.  */
  mode_t mode;
  if (!SystemTools::GetPermissions(source, mode) ||
      !SystemTools::SetPermissions(source, S_IWRITE))
    {
    SetLastError(err);
    return false;
    }
  if (DeleteFileW(ws.c_str()) ||
      GetLastError() == ERROR_FILE_NOT_FOUND ||
      GetLastError() == ERROR_PATH_NOT_FOUND)
    {
    return true;
    }
  /* Try to restore the original permissions.  */
  SystemTools::SetPermissions(source, mode);
  SetLastError(err);
  return false;
#else
  return unlink(source.c_str()) == 0 || errno == ENOENT;
#endif
}